

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O2

ssize_t __thiscall
ritobin::io::impl_binary_read::BinaryReader::read
          (BinaryReader *this,int __fd,void *__buf,size_t __nbytes)

{
  ushort *puVar1;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  puVar1 = (ushort *)((long)this->cur_ + 2);
  if (puVar1 <= this->cap_) {
    uVar2 = (ulong)*(ushort *)this->cur_;
    this->cur_ = (char *)puVar1;
    if ((ushort *)((long)puVar1 + uVar2) <= this->cap_) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_register_00000034,__fd),&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      this->cur_ = this->cur_ + uVar2;
      return CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
  }
  return 0;
}

Assistant:

bool read(std::string& value) noexcept {
            uint16_t size = {};
            if (!read(size)) {
                return false;
            }
            if (cur_ + size > cap_) {
                return false;
            }
            value = { cur_, size };
            cur_ += size;
            return true;
        }